

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

JavascriptRegExp *
Js::JavascriptRegExp::ToRegExp(Var var,PCWSTR varName,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  undefined4 extraout_var;
  JavascriptRegExp *local_68;
  RecyclableObject *reclObj;
  JavascriptRegExp *pJStack_50;
  TypeId remoteTypeId;
  JavascriptRegExp *regExp;
  ScriptContext *scriptContext_local;
  PCWSTR varName_local;
  Var var_local;
  Var local_28;
  PCWSTR local_20;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  regExp = (JavascriptRegExp *)scriptContext;
  scriptContext_local = (ScriptContext *)varName;
  varName_local = (PCWSTR)var;
  local_28 = var;
  bVar2 = VarIs<Js::JavascriptRegExp>(var);
  if (bVar2) {
    local_68 = UnsafeVarTo<Js::JavascriptRegExp>(local_28);
  }
  else {
    local_68 = (JavascriptRegExp *)0x0;
  }
  pJStack_50 = local_68;
  if (local_68 != (JavascriptRegExp *)0x0) {
    return local_68;
  }
  local_20 = varName_local;
  if (varName_local == (PCWSTR)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(local_20);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(local_20);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_20);
      if (pRStack_10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_14 = RecyclableObject::GetTypeId(pRStack_10);
      if ((0x57 < (int)local_14) && (BVar3 = RecyclableObject::IsExternal(pRStack_10), BVar3 == 0))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_18 = local_14;
    }
  }
  if (local_18 == TypeIds_HostDispatch) {
    reclObj._4_4_ = 0x58;
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(varName_local);
    iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x54])(pRVar6,(long)&reclObj + 4);
    if ((iVar4 != 0) && (reclObj._4_4_ == 0x23)) {
      iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x56])();
      return (JavascriptRegExp *)CONCAT44(extraout_var,iVar4);
    }
  }
  JavascriptError::ThrowTypeError((ScriptContext *)regExp,-0x7ff5ec38,(PCWSTR)scriptContext_local);
}

Assistant:

JavascriptRegExp* JavascriptRegExp::ToRegExp(Var var, PCWSTR varName, ScriptContext* scriptContext)
    {
        JavascriptRegExp * regExp = JavascriptOperators::TryFromVar<JavascriptRegExp>(var);
        if (regExp)
        {
            return regExp;
        }

        if (JavascriptOperators::GetTypeId(var) == TypeIds_HostDispatch)
        {
            TypeId remoteTypeId = TypeIds_Limit;
            RecyclableObject* reclObj = UnsafeVarTo<RecyclableObject>(var);
            if (reclObj->GetRemoteTypeId(&remoteTypeId) && remoteTypeId == TypeIds_RegEx)
            {
                return static_cast<JavascriptRegExp *>(reclObj->GetRemoteObject());
            }
        }

        JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedRegExp, varName);
    }